

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputeProbabilityOfTDistribution
               (double percentage_point,int degrees_of_freedom,double *probability)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (probability != (double *)0x0 && 0 < degrees_of_freedom) {
    dVar6 = (double)degrees_of_freedom;
    dVar5 = dVar6 / (percentage_point * percentage_point + dVar6);
    dVar3 = 1.0 - dVar5;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar4 = 0.0;
    dVar3 = (double)(~-(ulong)(percentage_point < 0.0) & (ulong)dVar3 |
                    (ulong)-dVar3 & -(ulong)(percentage_point < 0.0));
    uVar2 = degrees_of_freedom & 1U;
    while (uVar1 = uVar2 + 2, (int)uVar1 <= degrees_of_freedom) {
      dVar4 = dVar4 + dVar3;
      dVar3 = dVar3 * (((double)(int)(uVar2 + 1) * dVar5) / (double)(int)uVar1);
      uVar2 = uVar1;
    }
    if ((degrees_of_freedom & 1U) == 0) {
      dVar3 = (dVar4 + 1.0) * 0.5;
    }
    else {
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar3 = atan(percentage_point / dVar6);
      dVar3 = (dVar4 * SQRT(dVar5) + dVar3) / 3.141592653589793 + 0.5;
    }
    *probability = dVar3;
  }
  return probability != (double *)0x0 && 0 < degrees_of_freedom;
}

Assistant:

bool ComputeProbabilityOfTDistribution(double percentage_point,
                                       int degrees_of_freedom,
                                       double* probability) {
  if (degrees_of_freedom <= 0 || NULL == probability) {
    return false;
  }

  const double cosine_squared(
      degrees_of_freedom /
      (degrees_of_freedom + percentage_point * percentage_point));
  const double sine((percentage_point < 0.0) ? -std::sqrt(1.0 - cosine_squared)
                                             : std::sqrt(1.0 - cosine_squared));

  double sum(0.0);
  double prod(sine);
  for (int i(degrees_of_freedom % 2 + 2); i <= degrees_of_freedom; i += 2) {
    sum += prod;
    prod *= (i - 1) * cosine_squared / i;
  }
  if (0 == degrees_of_freedom % 2) {
    *probability = (1.0 + sum) / 2.0;
  } else {
    const double theta(
        std::atan(percentage_point / std::sqrt(degrees_of_freedom)));
    *probability = 0.5 + (sum * std::sqrt(cosine_squared) + theta) / sptk::kPi;
  }

  return true;
}